

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecPrimary(Parser *this)

{
  bool bVar1;
  TokenType TVar2;
  ParseError *__return_storage_ptr__;
  Parser *in_RSI;
  allocator<char> local_a1;
  undefined1 local_a0 [8];
  undefined1 local_98 [32];
  Token paren;
  undefined1 local_48 [32];
  
  bVar1 = consume(in_RSI,INTEGER);
  if (bVar1) {
    TVar2 = std::__cxx11::stoi(&(in_RSI->m_previous).lexeme,(size_t *)0x0,10);
    local_98._0_4_ = TVar2;
    std::make_unique<enact::IntegerExpr,int>((int *)&paren);
  }
  else {
    bVar1 = consume(in_RSI,FLOAT);
    if (bVar1) {
      local_98._0_8_ = std::__cxx11::stod(&(in_RSI->m_previous).lexeme,(size_t *)0x0);
      std::make_unique<enact::FloatExpr,double>((double *)&paren);
      goto LAB_0010bed0;
    }
    bVar1 = consume(in_RSI,TRUE);
    if (bVar1) {
      local_98[0] = 1;
    }
    else {
      bVar1 = consume(in_RSI,FALSE);
      if (!bVar1) {
        bVar1 = consume(in_RSI,STRING);
        if (bVar1) {
          std::make_unique<enact::StringExpr,std::__cxx11::string&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&paren);
          goto LAB_0010bed0;
        }
        bVar1 = consume(in_RSI,INTERPOLATION);
        if (bVar1) {
          parseInterpolationExpr(this);
          return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
                 (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
        }
        bVar1 = consume(in_RSI,IDENTIFIER);
        if (bVar1) {
          std::make_unique<enact::SymbolExpr,enact::Token&>(&paren);
          goto LAB_0010bed0;
        }
        bVar1 = consume(in_RSI,LEFT_PAREN);
        if (!bVar1) {
          __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&paren,"Expected expression.",(allocator<char> *)local_98);
          errorAtCurrent(__return_storage_ptr__,in_RSI,(string *)&paren);
          __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        Token::Token(&paren,&in_RSI->m_previous);
        bVar1 = consume(in_RSI,RIGHT_PAREN);
        if (bVar1) {
          std::make_unique<enact::UnitExpr,enact::Token>((Token *)local_98);
          local_a0 = (undefined1  [8])local_98._0_8_;
        }
        else {
          parseExpr((Parser *)local_a0);
          bVar1 = consume(in_RSI,RIGHT_PAREN);
          if (!bVar1) {
            local_48._0_8_ = 0;
            local_48._8_8_ = 0;
            local_48._16_4_ = 0;
            local_48._20_2_ = 0;
            local_48._22_2_ = 0;
            std::
            vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
            ::emplace_back<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
                      ((vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
                        *)local_48,
                       (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_a0);
            while (bVar1 = consume(in_RSI,COMMA), bVar1) {
              parseExpr((Parser *)local_98);
              std::
              vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
              ::emplace_back<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
                        ((vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
                          *)local_48,
                         (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_98);
              if ((CompileContext *)local_98._0_8_ != (CompileContext *)0x0) {
                (**(code **)(*(long *)local_98._0_8_ + 8))();
              }
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_98,"Expected \')\' after tuple elements.",&local_a1);
            expect(in_RSI,RIGHT_PAREN,(string *)local_98);
            std::__cxx11::string::~string((string *)local_98);
            std::
            make_unique<enact::TupleExpr,std::vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>,enact::Token>
                      ((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                        *)local_98,(Token *)local_48);
            this->m_context = (CompileContext *)local_98._0_8_;
            std::
            vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
            ::~vector((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                       *)local_48);
            if ((_Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>)local_a0 !=
                (Expr *)0x0) {
              (**(code **)(*(long *)local_a0 + 8))();
            }
            goto LAB_0010bfc1;
          }
        }
        this->m_context = (CompileContext *)local_a0;
LAB_0010bfc1:
        std::__cxx11::string::~string((string *)&paren.lexeme);
        return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
               (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
      }
      local_98._0_8_ = local_98._0_8_ & 0xffffffffffffff00;
    }
    std::make_unique<enact::BooleanExpr,bool>((bool *)&paren);
  }
LAB_0010bed0:
  this->m_context = (CompileContext *)paren._0_8_;
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecPrimary() {
        if (consume(TokenType::INTEGER)) {
            return std::make_unique<IntegerExpr>(std::stoi(m_previous.lexeme));
        }
        if (consume(TokenType::FLOAT)) {
            return std::make_unique<FloatExpr>(std::stod(m_previous.lexeme));
        }

        if (consume(TokenType::TRUE))  {
            return std::make_unique<BooleanExpr>(true);
        }
        if (consume(TokenType::FALSE)) {
            return std::make_unique<BooleanExpr>(false);
        }

        if (consume(TokenType::STRING)) {
            return std::make_unique<StringExpr>(m_previous.lexeme);
        }

        if (consume(TokenType::INTERPOLATION)) {
            return parseInterpolationExpr();
        }

        if (consume(TokenType::IDENTIFIER)) {
            return std::make_unique<SymbolExpr>(m_previous);
        }

        if (consume(TokenType::LEFT_PAREN)) {
            Token paren = m_previous;

            // Unit type ()
            if (consume(TokenType::RIGHT_PAREN)) return std::make_unique<UnitExpr>(std::move(paren));

            // Grouping (expr)
            std::unique_ptr<Expr> expr = parseExpr();
            if (consume(TokenType::RIGHT_PAREN)) return expr;

            // Tuple (expr, expr...)
            std::vector<std::unique_ptr<Expr>> elems{};
            elems.push_back(std::move(expr));
            while (consume(TokenType::COMMA)) {
                elems.push_back(parseExpr());
            }

            expect(TokenType::RIGHT_PAREN, "Expected ')' after tuple elements.");

            return std::make_unique<TupleExpr>(std::move(elems), std::move(paren));
        }

        throw errorAtCurrent("Expected expression.");
    }